

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O3

int __thiscall
TasGrid::GridLocalPolynomial::removePointsByHierarchicalCoefficient
          (GridLocalPolynomial *this,double tolerance,int output,double *scale_correction)

{
  int iVar1;
  int iVar2;
  pointer scale_correction_00;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  vector<double,_std::allocator<double>_> rescaled;
  allocator_type local_83;
  allocator_type local_82;
  bool local_81;
  double local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  vector<bool,_std::allocator<bool>_> local_48;
  
  local_80 = tolerance;
  (*(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid[0x18])();
  iVar2 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  scale_correction_00 = scale_correction;
  if (scale_correction == (double *)0x0) {
    iVar1 = 1;
    if (output == -1) {
      iVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    }
    local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x3ff0000000000000;
    ::std::vector<double,_std::allocator<double>_>::vector
              (&local_78,(long)(iVar1 * iVar2),(value_type_conflict2 *)&local_48,&local_82);
    scale_correction_00 =
         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  getScaledCoefficients(&local_60,this,output,scale_correction_00);
  if ((scale_correction == (double *)0x0) &&
     (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0)) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_81 = false;
  ::std::vector<bool,_std::allocator<bool>_>::vector(&local_48,(long)iVar2,&local_81,&local_83);
  if (0 < iVar2) {
    uVar3 = 0;
    do {
      uVar4 = 1L << ((byte)uVar3 & 0x3f);
      uVar5 = uVar3 >> 6 & 0x3ffffff;
      if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar3] <= local_80) {
        uVar4 = ~uVar4 & local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      else {
        uVar4 = uVar4 | local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar5];
      }
      local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p[uVar5] = uVar4;
      uVar3 = uVar3 + 1;
    } while ((long)iVar2 != uVar3);
  }
  iVar2 = removeMappedPoints(this,(vector<bool,_std::allocator<bool>_> *)&local_48);
  if (local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_48.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar2;
}

Assistant:

int GridLocalPolynomial::removePointsByHierarchicalCoefficient(double tolerance, int output, const double *scale_correction){
    clearRefinement();
    int num_points = points.getNumIndexes();

    int active_outputs = (output == -1) ? num_outputs : 1;
    std::vector<double> rescaled = getScaledCoefficients(output, (scale_correction == nullptr) ?
                                        std::vector<double>(num_points * active_outputs, 1.0).data() : scale_correction);

    std::vector<bool> pmap(num_points); // point map, set to true if the point is to be kept, false otherwise
    for(int i=0; i<num_points; i++) pmap[i] = (rescaled[i] > tolerance);

    return removeMappedPoints(pmap);
}